

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O1

Var Js::JavascriptWeakSet::EntryAdd(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptWeakSet *pJVar7;
  RecyclableObject *instance;
  RecyclableObject *this;
  BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *this_00;
  Type TVar8;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo local_48;
  CallInfo callInfo_local;
  RecyclableObject *keyObj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_48._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                ,0x50,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d38fe3;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])local_48;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,&local_48);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pvVar6 = Arguments::operator[]((Arguments *)local_68,0);
  bVar3 = VarIs<Js::JavascriptWeakSet>(pvVar6);
  if (!bVar3) {
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"WeakSet.prototype.add",L"WeakSet");
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_68,0);
  pJVar7 = VarTo<Js::JavascriptWeakSet>(pvVar6);
  if (((ulong)local_68 & 0xfffffe) == 0) {
    instance = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
  }
  else {
    instance = (RecyclableObject *)Arguments::operator[]((Arguments *)local_68,1);
  }
  BVar4 = JavascriptOperators::IsObject(instance);
  if (BVar4 != 0) {
    if (instance == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d38fe3;
      *puVar5 = 0;
    }
    if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d38fe3;
      *puVar5 = 0;
    }
    TVar8 = TypeIds_FirstNumberType;
    if ((((ulong)instance & 0xffff000000000000) != 0x1000000000000) &&
       (TVar8 = TypeIds_Number, (ulong)instance >> 0x32 == 0)) {
      this = UnsafeVarTo<Js::RecyclableObject>(instance);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00d38fe3;
        *puVar5 = 0;
      }
      TVar8 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar8) {
        BVar4 = RecyclableObject::IsExternal(this);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
LAB_00d38fe3:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
    if (TVar8 != TypeIds_HostDispatch) {
      callInfo_local = (CallInfo)VarTo<Js::RecyclableObject>(instance);
      if (pSVar1->TTDReplayModeEnabled == true) {
        this_00 = (BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                   *)Memory::
                     RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     ::operator->(&pSVar1->TTDContextInfo->TTDWeakReferencePinSet);
        args.super_Arguments.Values = (Type)callInfo_local;
        JsUtil::
        BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                  (this_00,(RecyclableObject **)&args.super_Arguments.Values,
                   (RecyclableObject **)&callInfo_local);
      }
      args.super_Arguments.Values = (Type)callInfo_local;
      keyObj._7_1_ = 1;
      JsUtil::
      SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
      ::
      Insert<(JsUtil::SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
                ((SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
                  *)&pJVar7->keySet,(TBKey *)&args.super_Arguments.Values,
                 (TBValue *)((long)&keyObj + 7));
      return pJVar7;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec03,L"WeakSet.prototype.add");
}

Assistant:

Var JavascriptWeakSet::EntryAdd(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakSet>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakSet.prototype.add"), _u("WeakSet"));
        }

        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

        if (!JavascriptOperators::IsObject(key) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch)
        {
            // HostDispatch is not expanded so can't have internal property added to it.
            // TODO: Support HostDispatch as WeakSet key
            JavascriptError::ThrowTypeError(scriptContext, JSERR_WeakMapSetKeyNotAnObject, _u("WeakSet.prototype.add"));
        }

        RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

#if ENABLE_TTD
        //In replay we need to pin the object (and will release at snapshot points) -- in record we don't need to do anything
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(keyObj);
        }
#endif

        weakSet->Add(keyObj);

        return weakSet;
    }